

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_atof.h
# Opt level: O2

uint Assimp::HexDigitToDecimal(char in)

{
  uint uVar1;
  undefined3 in_register_00000039;
  int iVar2;
  
  iVar2 = CONCAT31(in_register_00000039,in);
  if ((byte)(in - 0x30U) < 10) {
    return iVar2 - 0x30;
  }
  if ((byte)(in + 0x9fU) < 6) {
    return iVar2 - 0x57;
  }
  uVar1 = 0xffffffff;
  if ((byte)(in + 0xbfU) < 6) {
    uVar1 = iVar2 - 0x37;
  }
  return uVar1;
}

Assistant:

inline
unsigned int HexDigitToDecimal(char in) {
    unsigned int out( UINT_MAX );
    if ( in >= '0' && in <= '9' ) {
        out = in - '0';
    } else if ( in >= 'a' && in <= 'f' ) {
        out = 10u + in - 'a';
    } else if ( in >= 'A' && in <= 'F' ) {
        out = 10u + in - 'A';
    }

    // return value is UINT_MAX if the input is not a hex digit
    return out;
}